

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O2

bool Fixpp::impl::TagMatcher<Fixpp::Type::Int>::matchValue(Return *value,StreamCursor *cursor)

{
  bool bVar1;
  undefined7 in_register_00000001;
  Return local_14 [2];
  int val;
  
  local_14[0] = (Return)((uint7)in_register_00000001 >> 0x18);
  bVar1 = match_int_fast(local_14,cursor);
  if (bVar1) {
    *value = local_14[0];
  }
  return bVar1;
}

Assistant:

static bool matchValue(Return* value, StreamCursor& cursor)
            {
                int val;
                if (!match_int_fast(&val, cursor)) return false;

                *value = val;
                return true;
            }